

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnReturnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  char *pcVar1;
  Offset OVar2;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar3;
  Result RVar4;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> this_00;
  Location loc;
  Location loc_1;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_f0;
  Var local_e8;
  Location local_98;
  Var local_78;
  
  this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x178);
  local_e8.loc.field_1.field_0.line = 0;
  local_e8.loc.field_1.field_0.first_column = 0;
  local_e8.loc.field_1.field_0.last_column = 0;
  local_e8.loc.filename._M_len = 0;
  local_e8.loc.filename._M_str._0_4_ = 0;
  local_e8.loc.filename._M_str._4_4_ = 0;
  ReturnCallIndirectExpr::ReturnCallIndirectExpr
            ((ReturnCallIndirectExpr *)
             this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&local_e8.loc);
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e8.loc.field_1.field_0.last_column = 0;
  local_e8.loc.filename._M_len = strlen(pcVar1);
  local_e8.loc.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_e8.loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  local_e8.loc.field_1.field_0.line = (int)OVar2;
  local_e8.loc.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_78,sig_index,&local_e8.loc);
  SetFuncDeclaration(this,(FuncDeclaration *)
                          ((long)this_00.
                                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                 .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),
                     &local_78);
  Var::~Var(&local_78);
  pcVar1 = this->filename_;
  aVar3.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str = pcVar1;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar3.offset;
  Var::Var(&local_e8,table_index,&local_98);
  Var::operator=((Var *)((long)this_00.
                               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                               .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x130),
                 &local_e8);
  Var::~Var(&local_e8);
  local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar4 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_f0._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::OnReturnCallIndirectExpr(Index sig_index,
                                                Index table_index) {
  auto expr = std::make_unique<ReturnCallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index, GetLocation());
  return AppendExpr(std::move(expr));
}